

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
booster::callback<void_()>::
callable_impl<void,_cppcms::http::(anonymous_namespace)::dispatch_binder>::~callable_impl
          (callable_impl<void,_cppcms::http::(anonymous_namespace)::dispatch_binder> *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__callable_impl_00288690;
  pcVar1 = (this->func).matched._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->func).matched.field_2) {
    operator_delete(pcVar1);
  }
  intrusive_ptr<cppcms::application>::~intrusive_ptr(&(this->func).app);
  this_00 = (this->func).ctx.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__refcounted_00287bd8;
  booster::atomic_counter::~atomic_counter(&(this->super_callable_type).super_refcounted.refs_);
  operator_delete(this);
  return;
}

Assistant:

callable_impl(F f) : func(f){}